

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtConvexConcaveCollisionAlgorithm::calculateTimeOfImpact::LocalTriangleSphereCastCallback::
processTriangle(LocalTriangleSphereCastCallback *this,cbtVector3 *triangle,int partId,
               int triangleIndex)

{
  bool bVar1;
  CProfileSample __profile;
  cbtSubsimplexConvexCast convexCaster;
  cbtTransform ident;
  cbtSphereShape pointShape;
  cbtTriangleShape triShape;
  cbtVoronoiSimplexSolver simplexSolver;
  CProfileSample local_369;
  cbtSubsimplexConvexCast local_368;
  cbtTransform local_348;
  cbtSphereShape local_308;
  CastResult local_2c0;
  cbtTriangleShape local_1f8;
  cbtVoronoiSimplexSolver local_178;
  
  CProfileSample::CProfileSample(&local_369,"processTriangle");
  local_348.m_basis.m_el[0].m_floats[0] = 1.0;
  local_348.m_basis.m_el[0].m_floats[1] = 0.0;
  local_348.m_basis.m_el[0].m_floats[2] = 0.0;
  local_348.m_basis.m_el[0].m_floats[3] = 0.0;
  local_348.m_basis.m_el[1].m_floats[0] = 0.0;
  local_348.m_basis.m_el[1].m_floats[1] = 1.0;
  local_348.m_basis.m_el[1].m_floats[2] = 0.0;
  local_348.m_basis.m_el[1].m_floats[3] = 0.0;
  local_348.m_basis.m_el[2].m_floats[0] = 0.0;
  local_348.m_basis.m_el[2].m_floats[1] = 0.0;
  local_348.m_basis.m_el[2].m_floats[2] = 1.0;
  local_348.m_basis.m_el[2].m_floats[3] = 0.0;
  local_348.m_origin.m_floats[0] = 0.0;
  local_348.m_origin.m_floats[1] = 0.0;
  local_348.m_origin.m_floats[2] = 0.0;
  local_348.m_origin.m_floats[3] = 0.0;
  local_2c0._vptr_CastResult = (_func_int **)&PTR_DebugDraw_01193fa8;
  local_2c0.m_debugDrawer = (cbtIDebugDraw *)0x0;
  local_2c0.m_allowedPenetration = 0.0;
  local_2c0.m_subSimplexCastMaxIterations = 0x20;
  local_2c0.m_subSimplexCastEpsilon = 0.0001;
  local_2c0.m_fraction = this->m_hitFraction;
  cbtSphereShape::cbtSphereShape(&local_308,this->m_ccdSphereRadius);
  cbtTriangleShape::cbtTriangleShape(&local_1f8,triangle,triangle + 1,triangle + 2);
  local_178.m_equalVertexThreshold = 0.0001;
  local_178.m_cachedBC.m_usedVertices._0_1_ = 0;
  cbtSubsimplexConvexCast::cbtSubsimplexConvexCast
            (&local_368,(cbtConvexShape *)&local_308,(cbtConvexShape *)&local_1f8,&local_178);
  bVar1 = cbtSubsimplexConvexCast::calcTimeOfImpact
                    (&local_368,&this->m_ccdSphereFromTrans,&this->m_ccdSphereToTrans,&local_348,
                     &local_348,&local_2c0);
  if ((bVar1) && (local_2c0.m_fraction < this->m_hitFraction)) {
    this->m_hitFraction = local_2c0.m_fraction;
  }
  cbtConvexCast::~cbtConvexCast(&local_368.super_cbtConvexCast);
  cbtPolyhedralConvexShape::~cbtPolyhedralConvexShape(&local_1f8.super_cbtPolyhedralConvexShape);
  cbtConvexShape::~cbtConvexShape((cbtConvexShape *)&local_308);
  CProfileSample::~CProfileSample(&local_369);
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
		{
			BT_PROFILE("processTriangle");
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			cbtTransform ident;
			ident.setIdentity();
			cbtConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			cbtSphereShape pointShape(m_ccdSphereRadius);
			cbtTriangleShape triShape(triangle[0], triangle[1], triangle[2]);
			cbtVoronoiSimplexSolver simplexSolver;
			cbtSubsimplexConvexCast convexCaster(&pointShape, &triShape, &simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans, m_ccdSphereToTrans,
											  ident, ident, castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}
		}